

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktShaderRenderTextureFunctionTests.cpp
# Opt level: O1

void vkt::sr::anon_unknown_0::evalTexture1DShadowProjGrad
               (ShaderEvalContext *c,TexLookupParams *param_2)

{
  float fVar1;
  float fVar2;
  Texture1D *pTVar3;
  uint uVar4;
  float fVar5;
  float fVar6;
  float fVar7;
  IVec2 local_10;
  
  fVar6 = c->in[0].m_data[0];
  fVar1 = c->in[0].m_data[2];
  fVar2 = c->in[0].m_data[3];
  fVar5 = (float)(c->textures[0].tex1D)->m_width;
  fVar7 = c->in[1].m_data[0] * fVar5;
  fVar5 = fVar5 * c->in[2].m_data[0];
  uVar4 = -(uint)(-fVar7 <= fVar7);
  fVar7 = (float)(~uVar4 & (uint)-fVar7 | (uint)fVar7 & uVar4);
  uVar4 = -(uint)(-fVar5 <= fVar5);
  fVar5 = (float)(~uVar4 & (uint)-fVar5 | (uint)fVar5 & uVar4);
  uVar4 = -(uint)(fVar5 <= fVar7);
  fVar5 = logf((float)(~uVar4 & (uint)fVar5 | uVar4 & (uint)fVar7));
  pTVar3 = c->textures[0].tex1D;
  local_10.m_data[0] = 0;
  local_10.m_data[1] = 0;
  fVar6 = tcu::sampleLevelArray1DCompare
                    ((pTVar3->m_view).m_levels,(pTVar3->m_view).m_numLevels,&c->textures[0].sampler,
                     fVar1 / fVar2,fVar6 / fVar2,fVar5 * 1.442695,&local_10);
  (c->color).m_data[0] = fVar6;
  return;
}

Assistant:

static void		evalTexture1DShadowProjGrad			(ShaderEvalContext& c, const TexLookupParams&)		{ c.color.x() = texture1DShadow(c, c.in[0].z()/c.in[0].w(), c.in[0].x()/c.in[0].w(), computeLodFromGrad1D(c)); }